

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O1

IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *
IoTHubMessage_GetDiagnosticPropertyData(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle)

{
  LOGGER_LOG p_Var1;
  IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *pIVar2;
  
  if (iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      pIVar2 = (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)0x0;
    }
    else {
      pIVar2 = (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)0x0;
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"IoTHubMessage_GetDiagnosticPropertyData",0x363,1,
                "Invalid argument (iotHubMessageHandle is NULL)");
    }
  }
  else {
    pIVar2 = iotHubMessageHandle->diagnosticData;
  }
  return pIVar2;
}

Assistant:

const IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA* IoTHubMessage_GetDiagnosticPropertyData(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle)
{
    const IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA* result;
    if (iotHubMessageHandle == NULL)
    {
        LogError("Invalid argument (iotHubMessageHandle is NULL)");
        result = NULL;
    }
    else
    {
        result = iotHubMessageHandle->diagnosticData;
    }
    return result;
}